

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

string * __thiscall
wabt::anon_unknown_77::BinaryReaderIR::GetUniqueName
          (string *__return_storage_ptr__,BinaryReaderIR *this,BindingHash *bindings,
          string *orig_name)

{
  undefined8 *puVar1;
  __buckets_ptr pp_Var2;
  uint uVar3;
  uint uVar4;
  string *psVar5;
  undefined8 *puVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  BinaryReaderIR *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pp_Var2 = (bindings->
            super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
            )._M_h._M_buckets;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pp_Var2,
             (bindings->
             super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
             )._M_h._M_bucket_count + (long)pp_Var2);
  local_38 = this;
  psVar5 = (string *)
           std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                    *)this,__return_storage_ptr__);
  if (psVar5 != (string *)0x0) {
    __val = 1;
    do {
      local_58 = local_48;
      pp_Var2 = (bindings->
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                )._M_h._M_buckets;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pp_Var2,
                 (bindings->
                 super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                 )._M_h._M_bucket_count + (long)pp_Var2);
      std::__cxx11::string::append((char *)&local_58);
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar4 = (uint)uVar7;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_0013e7c2;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_0013e7c2;
          }
          if (uVar4 < 10000) goto LAB_0013e7c2;
          uVar7 = uVar7 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_0013e7c2:
      local_98 = local_88;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,__len,__val);
      uVar7 = 0xf;
      if (local_58 != local_48) {
        uVar7 = local_48[0];
      }
      if (uVar7 < (ulong)(local_90 + local_50)) {
        uVar7 = 0xf;
        if (local_98 != local_88) {
          uVar7 = local_88[0];
        }
        if (uVar7 < (ulong)(local_90 + local_50)) goto LAB_0013e832;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_58);
      }
      else {
LAB_0013e832:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98);
      }
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_68 = *puVar1;
        uStack_60 = puVar6[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *puVar1;
        local_78 = (undefined8 *)*puVar6;
      }
      local_70 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      __val = __val + 1;
      psVar5 = (string *)
               std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                        *)local_38,__return_storage_ptr__);
    } while (psVar5 != (string *)0x0);
  }
  return psVar5;
}

Assistant:

std::string BinaryReaderIR::GetUniqueName(BindingHash* bindings,
                                          const std::string& orig_name) {
  int counter = 1;
  std::string unique_name = orig_name;
  while (bindings->count(unique_name) != 0) {
    unique_name = orig_name + "." + std::to_string(counter++);
  }
  return unique_name;
}